

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IniTest.cpp
# Opt level: O2

void __thiscall TApp_IniNotRequired_Test::TestBody(TApp_IniNotRequired_Test *this)

{
  App *this_00;
  input_t *piVar1;
  ostream *poVar2;
  char *pcVar3;
  long lVar4;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3a0;
  AssertHelper local_398;
  int three;
  int two;
  int one;
  TempFile tmpini;
  string local_360;
  string local_340;
  string local_320;
  string local_300;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  ofstream out;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_218 [3];
  string local_200 [32];
  undefined1 local_1e0 [448];
  
  std::__cxx11::string::string((string *)&local_240,"TestIniTmp.ini",(allocator *)&out);
  TempFile::TempFile(&tmpini,&local_240);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::string((string *)&local_260,"--config",(allocator *)&out);
  std::__cxx11::string::string((string *)&local_280,(string *)&tmpini);
  std::__cxx11::string::string((string *)&local_2a0,"Read an ini file",(allocator *)&local_3a0);
  this_00 = &(this->super_TApp).app;
  CLI::App::set_config(this_00,&local_260,&local_280,&local_2a0,false);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::~string((string *)&local_280);
  std::__cxx11::string::~string((string *)&local_260);
  std::ofstream::ofstream(&out,(string *)&tmpini,_S_out);
  poVar2 = std::operator<<((ostream *)&out,"[default]");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&out,"two=99");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&out,"three=3");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::ofstream::~ofstream(&out);
  one = 0;
  two = 0;
  three = 0;
  std::__cxx11::string::string((string *)&local_2c0,"--one",(allocator *)&out);
  std::__cxx11::string::string((string *)&local_2e0,"",(allocator *)&local_3a0);
  CLI::App::add_option<int,_(CLI::detail::enabler)0>(this_00,&local_2c0,&one,&local_2e0);
  std::__cxx11::string::~string((string *)&local_2e0);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::__cxx11::string::string((string *)&local_300,"--two",(allocator *)&out);
  std::__cxx11::string::string((string *)&local_320,"",(allocator *)&local_3a0);
  CLI::App::add_option<int,_(CLI::detail::enabler)0>(this_00,&local_300,&two,&local_320);
  std::__cxx11::string::~string((string *)&local_320);
  std::__cxx11::string::~string((string *)&local_300);
  std::__cxx11::string::string((string *)&local_340,"--three",(allocator *)&out);
  pcVar3 = "";
  std::__cxx11::string::string((string *)&local_360,"",(allocator *)&local_3a0);
  CLI::App::add_option<int,_(CLI::detail::enabler)0>(this_00,&local_340,&three,&local_360);
  std::__cxx11::string::~string((string *)&local_360);
  std::__cxx11::string::~string((string *)&local_340);
  std::__cxx11::string::string((string *)&out,"--one=1",(allocator *)&local_3a0);
  piVar1 = &(this->super_TApp).args;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,&out,
             local_200);
  std::__cxx11::string::~string((string *)&out);
  TApp::run(&this->super_TApp);
  local_3a0.ptr_._0_4_ = 1;
  testing::internal::CmpHelperEQ<int,int>((internal *)&out,"1","one",(int *)&local_3a0,&one);
  if (out == (ofstream)0x0) {
    testing::Message::Message((Message *)&local_3a0);
    if (local_218[0].ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = ((local_218[0].ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/IniTest.cpp"
               ,0xb7,pcVar3);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_3a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(local_218);
  local_3a0.ptr_._0_4_ = 99;
  testing::internal::CmpHelperEQ<int,int>((internal *)&out,"99","two",(int *)&local_3a0,&two);
  if (out == (ofstream)0x0) {
    testing::Message::Message((Message *)&local_3a0);
    if (local_218[0].ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_218[0].ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/IniTest.cpp"
               ,0xb8,pcVar3);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_3a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(local_218);
  local_3a0.ptr_._0_4_ = 3;
  testing::internal::CmpHelperEQ<int,int>((internal *)&out,"3","three",(int *)&local_3a0,&three);
  if (out == (ofstream)0x0) {
    testing::Message::Message((Message *)&local_3a0);
    if (local_218[0].ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_218[0].ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/IniTest.cpp"
               ,0xb9,pcVar3);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_3a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(local_218);
  CLI::App::reset(this_00);
  three = 0;
  two = 0;
  one = 0;
  std::__cxx11::string::string((string *)&out,"--one=1",(allocator *)&local_3a0);
  std::__cxx11::string::string(local_200,"--two=2",(allocator *)&local_398);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,&out,
             local_1e0);
  lVar4 = 0x20;
  do {
    std::__cxx11::string::~string((string *)(&out + lVar4));
    lVar4 = lVar4 + -0x20;
  } while (lVar4 != -0x20);
  TApp::run(&this->super_TApp);
  local_3a0.ptr_._0_4_ = 1;
  testing::internal::CmpHelperEQ<int,int>((internal *)&out,"1","one",(int *)&local_3a0,&one);
  if (out == (ofstream)0x0) {
    testing::Message::Message((Message *)&local_3a0);
    if (local_218[0].ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_218[0].ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/IniTest.cpp"
               ,0xc1,pcVar3);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_3a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(local_218);
  local_3a0.ptr_._0_4_ = 2;
  testing::internal::CmpHelperEQ<int,int>((internal *)&out,"2","two",(int *)&local_3a0,&two);
  if (out == (ofstream)0x0) {
    testing::Message::Message((Message *)&local_3a0);
    if (local_218[0].ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_218[0].ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/IniTest.cpp"
               ,0xc2,pcVar3);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_3a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(local_218);
  local_3a0.ptr_._0_4_ = 3;
  testing::internal::CmpHelperEQ<int,int>((internal *)&out,"3","three",(int *)&local_3a0,&three);
  if (out == (ofstream)0x0) {
    testing::Message::Message((Message *)&local_3a0);
    if (local_218[0].ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_218[0].ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/IniTest.cpp"
               ,0xc3,pcVar3);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_3a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(local_218);
  TempFile::~TempFile(&tmpini);
  return;
}

Assistant:

TEST_F(TApp, IniNotRequired) {

    TempFile tmpini{"TestIniTmp.ini"};

    app.set_config("--config", tmpini);

    {
        std::ofstream out{tmpini};
        out << "[default]" << std::endl;
        out << "two=99" << std::endl;
        out << "three=3" << std::endl;
    }

    int one = 0, two = 0, three = 0;
    app.add_option("--one", one);
    app.add_option("--two", two);
    app.add_option("--three", three);

    args = {"--one=1"};

    run();

    EXPECT_EQ(1, one);
    EXPECT_EQ(99, two);
    EXPECT_EQ(3, three);

    app.reset();
    one = two = three = 0;
    args = {"--one=1", "--two=2"};

    run();

    EXPECT_EQ(1, one);
    EXPECT_EQ(2, two);
    EXPECT_EQ(3, three);
}